

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O2

void __thiscall FRandom::GenRandAll(FRandom *this)

{
  w128_t *r;
  w128_t *c;
  w128_t *d;
  long lVar1;
  w128_t *pwVar2;
  bool bVar3;
  
  pwVar2 = (this->sfmt).w128 + 2;
  lVar1 = 3;
  c = (this->sfmt).w128 + 3;
  d = (this->sfmt).w128 + 4;
  while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    r = pwVar2 + -2;
    do_recursion(r,r,pwVar2,c,d);
    pwVar2 = pwVar2 + 1;
    c = d;
    d = r;
  }
  lVar1 = 2;
  pwVar2 = (this->sfmt).w128 + 3;
  while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    do_recursion(pwVar2,pwVar2,pwVar2 + -3,c,d);
    c = d;
    d = pwVar2;
    pwVar2 = pwVar2 + 1;
  }
  return;
}

Assistant:

void FRandom::GenRandAll()
{
	int i;
	w128_t *r1, *r2;

	r1 = &sfmt.w128[SFMT::N - 2];
	r2 = &sfmt.w128[SFMT::N - 1];
	for (i = 0; i < SFMT::N - POS1; i++) {
		do_recursion(&sfmt.w128[i], &sfmt.w128[i], &sfmt.w128[i + POS1], r1, r2);
		r1 = r2;
		r2 = &sfmt.w128[i];
	}
	for (; i < SFMT::N; i++) {
		do_recursion(&sfmt.w128[i], &sfmt.w128[i], &sfmt.w128[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &sfmt.w128[i];
	}
}